

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.c++
# Opt level: O0

Array<kj::_::HashBucket> * __thiscall
kj::_::rehash(Array<kj::_::HashBucket> *__return_storage_ptr__,_ *this,
             ArrayPtr<const_kj::_::HashBucket> oldBuckets,size_t targetSize)

{
  uint uVar1;
  bool bVar2;
  size_t sVar3;
  HashBucket *pHVar4;
  HashBucket *this_00;
  HashBucket *newBucket;
  uint i;
  HashBucket *oldBucket;
  HashBucket *__end2;
  HashBucket *__begin2;
  ArrayPtr<const_kj::_::HashBucket> *__range2;
  size_t local_48;
  size_t size;
  Fault local_30;
  Fault f;
  size_t targetSize_local;
  ArrayPtr<const_kj::_::HashBucket> oldBuckets_local;
  Array<kj::_::HashBucket> *newBuckets;
  
  f.exception = (Exception *)oldBuckets.size_;
  oldBuckets_local.ptr = oldBuckets.ptr;
  targetSize_local = (size_t)this;
  oldBuckets_local.size_ = (size_t)__return_storage_ptr__;
  if (f.exception < (Exception *)0x40000000) {
    local_48 = chooseHashTableSize((uint)oldBuckets.size_);
    sVar3 = ArrayPtr<const_kj::_::HashBucket>::size
                      ((ArrayPtr<const_kj::_::HashBucket> *)&targetSize_local);
    if (local_48 < sVar3) {
      local_48 = ArrayPtr<const_kj::_::HashBucket>::size
                           ((ArrayPtr<const_kj::_::HashBucket> *)&targetSize_local);
    }
    heapArray<kj::_::HashBucket>(__return_storage_ptr__,local_48);
    pHVar4 = Array<kj::_::HashBucket>::begin(__return_storage_ptr__);
    memset(pHVar4,0,local_48 << 3);
    __end2 = ArrayPtr<const_kj::_::HashBucket>::begin
                       ((ArrayPtr<const_kj::_::HashBucket> *)&targetSize_local);
    pHVar4 = ArrayPtr<const_kj::_::HashBucket>::end
                       ((ArrayPtr<const_kj::_::HashBucket> *)&targetSize_local);
    for (; __end2 != pHVar4; __end2 = __end2 + 1) {
      bVar2 = HashBucket::isOccupied(__end2);
      if (bVar2) {
        uVar1 = __end2->hash;
        sVar3 = Array<kj::_::HashBucket>::size(__return_storage_ptr__);
        newBucket._4_4_ = (uint)((ulong)uVar1 % sVar3);
        while( true ) {
          this_00 = Array<kj::_::HashBucket>::operator[]
                              (__return_storage_ptr__,(ulong)newBucket._4_4_);
          bVar2 = HashBucket::isEmpty(this_00);
          if (bVar2) break;
          sVar3 = probeHash(__return_storage_ptr__,(ulong)newBucket._4_4_);
          newBucket._4_4_ = (uint)sVar3;
        }
        *this_00 = *__end2;
      }
    }
    return __return_storage_ptr__;
  }
  Debug::Fault::Fault<kj::Exception::Type,char_const(&)[36]>
            (&local_30,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/table.c++"
             ,0x99,FAILED,"targetSize < (1 << 30)","\"hash table has reached maximum size\"",
             (char (*) [36])"hash table has reached maximum size");
  Debug::Fault::fatal(&local_30);
}

Assistant:

kj::Array<HashBucket> rehash(kj::ArrayPtr<const HashBucket> oldBuckets, size_t targetSize) {
  // Rehash the whole table.

  KJ_REQUIRE(targetSize < (1 << 30), "hash table has reached maximum size");

  size_t size = chooseHashTableSize(targetSize);

  if (size < oldBuckets.size()) {
    size = oldBuckets.size();
  }

  auto newBuckets = kj::heapArray<HashBucket>(size);
  memset(newBuckets.begin(), 0, sizeof(HashBucket) * size);

  for (auto& oldBucket: oldBuckets) {
    if (oldBucket.isOccupied()) {
      for (uint i = oldBucket.hash % newBuckets.size();; i = probeHash(newBuckets, i)) {
        auto& newBucket = newBuckets[i];
        if (newBucket.isEmpty()) {
          newBucket = oldBucket;
          break;
        }
      }
    }
  }

  return newBuckets;
}